

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  fpclass_type fVar1;
  int32_t iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  undefined4 *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  undefined4 *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  fpclass_type *pfVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  norm;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_788 [32];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [13];
  undefined3 uStack_71b;
  int iStack_718;
  bool bStack_714;
  undefined8 local_710;
  int local_6fc;
  int32_t local_6f8;
  fpclass_type local_6f4;
  cpp_dec_float<200U,_int,_void> *local_6f0;
  undefined1 local_6e8 [32];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [13];
  undefined3 uStack_67b;
  int iStack_678;
  bool bStack_674;
  undefined8 local_670;
  shared_ptr<soplex::Tolerances> local_668;
  shared_ptr<soplex::Tolerances> local_658;
  undefined1 local_648 [32];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [13];
  undefined3 uStack_5db;
  int iStack_5d8;
  bool bStack_5d4;
  undefined8 local_5d0;
  cpp_dec_float<200U,_int,_void> *local_5c0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_5b8;
  undefined1 local_568 [32];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [13];
  undefined3 uStack_4fb;
  int iStack_4f8;
  bool bStack_4f4;
  undefined8 local_4f0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4e8;
  undefined1 local_498 [32];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [13];
  undefined3 uStack_42b;
  int iStack_428;
  bool bStack_424;
  undefined8 local_420;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [13];
  undefined3 uStack_3ab;
  int iStack_3a8;
  bool bStack_3a4;
  undefined8 local_3a0;
  cpp_dec_float<200U,_int,_void> local_390;
  cpp_dec_float<200U,_int,_void> local_310;
  cpp_dec_float<200U,_int,_void> local_290;
  cpp_dec_float<200U,_int,_void> local_210;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar19 = 0;
  iVar4 = (this->matrix).thesize;
  lVar17 = (long)iVar4;
  local_420._0_4_ = cpp_dec_float_finite;
  local_420._4_4_ = 0x1c;
  local_498._0_16_ = (undefined1  [16])0x0;
  local_498._16_16_ = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = (undefined1  [16])0x0;
  local_458 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = SUB1613((undefined1  [16])0x0,0);
  uStack_42b = 0;
  iStack_428 = 0;
  bStack_424 = false;
  local_3a0._0_4_ = cpp_dec_float_finite;
  local_3a0._4_4_ = 0x1c;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = (undefined1  [16])0x0;
  local_3b8 = SUB1613((undefined1  [16])0x0,0);
  uStack_3ab = 0;
  iStack_3a8 = 0;
  bStack_3a4 = false;
  local_5d0._0_4_ = cpp_dec_float_finite;
  local_5d0._4_4_ = 0x1c;
  local_648._0_16_ = (undefined1  [16])0x0;
  local_648._16_16_ = (undefined1  [16])0x0;
  local_628 = (undefined1  [16])0x0;
  local_618 = (undefined1  [16])0x0;
  local_608 = (undefined1  [16])0x0;
  local_5f8 = (undefined1  [16])0x0;
  local_5e8 = SUB1613((undefined1  [16])0x0,0);
  uStack_5db = 0;
  iStack_5d8 = 0;
  bStack_5d4 = false;
  local_4f0._0_4_ = cpp_dec_float_finite;
  local_4f0._4_4_ = 0x1c;
  local_568._0_16_ = (undefined1  [16])0x0;
  local_568._16_16_ = (undefined1  [16])0x0;
  local_548 = (undefined1  [16])0x0;
  local_538 = (undefined1  [16])0x0;
  local_528 = (undefined1  [16])0x0;
  local_518 = (undefined1  [16])0x0;
  local_508 = SUB1613((undefined1  [16])0x0,0);
  uStack_4fb = 0;
  iStack_4f8 = 0;
  bStack_4f4 = false;
  local_6f0 = &tolerance->m_backend;
  if (lVar17 < 1) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[4] = 0;
    (pcVar12->data)._M_elems[5] = 0;
    (pcVar12->data)._M_elems[6] = 0;
    (pcVar12->data)._M_elems[7] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[8] = 0;
    (pcVar12->data)._M_elems[9] = 0;
    (pcVar12->data)._M_elems[10] = 0;
    (pcVar12->data)._M_elems[0xb] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[0xc] = 0;
    (pcVar12->data)._M_elems[0xd] = 0;
    (pcVar12->data)._M_elems[0xe] = 0;
    (pcVar12->data)._M_elems[0xf] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[0x10] = 0;
    (pcVar12->data)._M_elems[0x11] = 0;
    (pcVar12->data)._M_elems[0x12] = 0;
    (pcVar12->data)._M_elems[0x13] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[0x14] = 0;
    (pcVar12->data)._M_elems[0x15] = 0;
    (pcVar12->data)._M_elems[0x16] = 0;
    (pcVar12->data)._M_elems[0x17] = 0;
    pcVar12 = &__return_storage_ptr__->m_backend;
    (pcVar12->data)._M_elems[0x18] = 0;
    (pcVar12->data)._M_elems[0x19] = 0;
    (pcVar12->data)._M_elems[0x1a] = 0;
    (pcVar12->data)._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_5b8,iVar4,&local_658);
    if (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_658.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->theLP->
         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_4e8,iVar4,&local_668);
    if (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_668.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&__return_storage_ptr__->m_backend,0,(type *)0x0);
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])();
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_290,lVar17,(type *)0x0);
      local_710._0_4_ = cpp_dec_float_finite;
      local_710._4_4_ = 0x1c;
      local_788._0_16_ = (undefined1  [16])0x0;
      local_788._16_16_ = (undefined1  [16])0x0;
      local_768 = (undefined1  [16])0x0;
      local_758 = (undefined1  [16])0x0;
      local_748 = (undefined1  [16])0x0;
      local_738 = (undefined1  [16])0x0;
      local_728 = SUB1613((undefined1  [16])0x0,0);
      uStack_71b = 0;
      iStack_718 = 0;
      bStack_714 = false;
      local_670._0_4_ = cpp_dec_float_finite;
      local_670._4_4_ = 0x1c;
      local_6e8._0_16_ = (undefined1  [16])0x0;
      local_6e8._16_16_ = (undefined1  [16])0x0;
      local_6c8 = (undefined1  [16])0x0;
      local_6b8 = (undefined1  [16])0x0;
      local_6a8 = (undefined1  [16])0x0;
      local_698 = (undefined1  [16])0x0;
      local_688 = SUB1613((undefined1  [16])0x0,0);
      uStack_67b = 0;
      iStack_678 = 0;
      bStack_674 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_6e8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_788,
                 (cpp_dec_float<200U,_int,_void> *)local_6e8,&local_290);
      puVar11 = (uint *)local_788;
      puVar15 = (uint *)local_648;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar15 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      iStack_5d8 = iStack_718;
      bStack_5d4 = bStack_714;
      local_5d0._0_4_ = (fpclass_type)local_710;
      local_5d0._4_4_ = local_710._4_4_;
      pfVar16 = &((local_5b8.
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).fpclass;
      lVar5 = 0;
      do {
        puVar11 = (uint *)local_648;
        puVar15 = local_a0;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar15 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        lVar6 = (long)local_5b8.super_IdxSet.num;
        local_5b8.super_IdxSet.num = local_5b8.super_IdxSet.num + 1;
        local_5b8.super_IdxSet.idx[lVar6] = (int)lVar5;
        puVar11 = local_a0;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)(pfVar16 + -0x1e);
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar11;
          puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
        }
        pfVar16[-2] = iStack_718;
        *(bool *)(pfVar16 + -1) = bStack_714;
        *(undefined8 *)pfVar16 = local_710;
        lVar5 = lVar5 + 1;
        pfVar16 = pfVar16 + 0x20;
      } while (lVar17 != lVar5);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_4e8,&local_5b8);
      local_5c0 = &__return_storage_ptr__->m_backend;
      if (0 < maxiters) {
        uVar7 = 0;
        do {
          puVar8 = (undefined4 *)local_648;
          puVar13 = (undefined4 *)local_568;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar13 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar19 * -2 + 1;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
          }
          iStack_4f8 = iStack_5d8;
          bStack_4f4 = bStack_5d4;
          local_4f0._0_4_ = (fpclass_type)local_5d0;
          local_4f0._4_4_ = local_5d0._4_4_;
          multBaseWith(this,&local_5b8,&local_4e8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6e8,&local_4e8);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_6e8;
          puVar11 = (uint *)local_648;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar11 = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          }
          iStack_5d8 = iStack_678;
          bStack_5d4 = bStack_674;
          fVar1 = (fpclass_type)local_670;
          iVar2 = local_670._4_4_;
          local_5d0._0_4_ = (fpclass_type)local_670;
          local_5d0._4_4_ = local_670._4_4_;
          if (2 < uVar7) {
            puVar11 = (uint *)local_648;
            pcVar12 = &local_310;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            }
            local_310.exp = iStack_678;
            local_310.neg = bStack_674;
            local_310.fpclass = fVar1;
            local_310.prec_elem = iVar2;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_310,(cpp_dec_float<200U,_int,_void> *)local_568);
            pcVar12 = local_6f0;
            pcVar10 = &local_310;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_6e8;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar14->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4);
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
            }
            iStack_678 = local_310.exp;
            bStack_674 = local_310.neg;
            local_670._4_4_ = local_310.prec_elem;
            local_670._0_4_ = local_310.fpclass;
            if ((local_310.neg == true) &&
               (local_310.fpclass != cpp_dec_float_finite || local_6e8._0_4_ != 0)) {
              bStack_674 = false;
            }
            local_710._0_4_ = cpp_dec_float_finite;
            local_710._4_4_ = 0x1c;
            local_788._0_16_ = (undefined1  [16])0x0;
            local_788._16_16_ = (undefined1  [16])0x0;
            local_768 = (undefined1  [16])0x0;
            local_758 = (undefined1  [16])0x0;
            local_748 = (undefined1  [16])0x0;
            local_738 = (undefined1  [16])0x0;
            local_728 = SUB1613((undefined1  [16])0x0,0);
            uStack_71b = 0;
            iStack_718 = 0;
            bStack_714 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_788 != local_6f0) {
              pcVar10 = local_6f0;
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_788;
              for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4)
                ;
              }
              iStack_718 = pcVar12->exp;
              bStack_714 = pcVar12->neg;
              local_710._0_4_ = pcVar12->fpclass;
              local_710._4_4_ = pcVar12->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_788,
                       (cpp_dec_float<200U,_int,_void> *)local_648);
            if ((((fpclass_type)local_670 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_710 != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_6e8,
                                   (cpp_dec_float<200U,_int,_void> *)local_788), iVar4 < 0)) break;
          }
          multWithBase(this,&local_4e8,&local_5b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_290,&local_5b8);
          local_710._0_4_ = cpp_dec_float_finite;
          local_710._4_4_ = 0x1c;
          local_788._0_16_ = (undefined1  [16])0x0;
          local_788._16_16_ = (undefined1  [16])0x0;
          local_768 = (undefined1  [16])0x0;
          local_758 = (undefined1  [16])0x0;
          local_748 = (undefined1  [16])0x0;
          local_738 = (undefined1  [16])0x0;
          local_728 = SUB1613((undefined1  [16])0x0,0);
          uStack_71b = 0;
          iStack_718 = 0;
          bStack_714 = false;
          local_670._0_4_ = cpp_dec_float_finite;
          local_670._4_4_ = 0x1c;
          local_6e8._0_16_ = (undefined1  [16])0x0;
          local_6e8._16_16_ = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = SUB1613((undefined1  [16])0x0,0);
          uStack_67b = 0;
          iStack_678 = 0;
          bStack_674 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_6e8,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_788,
                     (cpp_dec_float<200U,_int,_void> *)local_6e8,&local_290);
          puVar11 = (uint *)local_788;
          puVar15 = (uint *)local_568;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          iStack_4f8 = iStack_718;
          bStack_4f4 = bStack_714;
          fVar1 = (fpclass_type)local_710;
          iVar2 = local_710._4_4_;
          local_4f0._0_4_ = (fpclass_type)local_710;
          local_4f0._4_4_ = local_710._4_4_;
          puVar11 = (uint *)local_568;
          pcVar12 = &local_190;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          }
          local_190.exp = iStack_718;
          local_190.neg = bStack_714;
          local_190.fpclass = fVar1;
          local_190.prec_elem = iVar2;
          if (0 < (long)local_5b8.super_IdxSet.num) {
            uVar18 = (long)local_5b8.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_5b8.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_5b8.super_IdxSet.idx[uVar18 - 2]].m_backend,&local_190);
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != maxiters);
      }
      bVar3 = bStack_5d4;
      iVar4 = iStack_5d8;
      puVar8 = (undefined4 *)local_648;
      puVar13 = (undefined4 *)local_498;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar13 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar19 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      }
      iStack_428 = iStack_5d8;
      bStack_424 = bStack_5d4;
      local_6f4 = (fpclass_type)local_5d0;
      local_6f8 = local_5d0._4_4_;
      local_420._0_4_ = (fpclass_type)local_5d0;
      local_420._4_4_ = local_5d0._4_4_;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_5b8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_4e8);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_290,lVar17,(type *)0x0);
      local_710._0_4_ = cpp_dec_float_finite;
      local_710._4_4_ = 0x1c;
      local_788._0_16_ = (undefined1  [16])0x0;
      local_788._16_16_ = (undefined1  [16])0x0;
      local_768 = (undefined1  [16])0x0;
      local_758 = (undefined1  [16])0x0;
      local_748 = (undefined1  [16])0x0;
      local_738 = (undefined1  [16])0x0;
      local_728 = SUB1613((undefined1  [16])0x0,0);
      uStack_71b = 0;
      iStack_718 = 0;
      bStack_714 = false;
      local_670._0_4_ = cpp_dec_float_finite;
      local_670._4_4_ = 0x1c;
      local_6e8._0_16_ = (undefined1  [16])0x0;
      local_6e8._16_16_ = (undefined1  [16])0x0;
      local_6c8 = (undefined1  [16])0x0;
      local_6b8 = (undefined1  [16])0x0;
      local_6a8 = (undefined1  [16])0x0;
      local_698 = (undefined1  [16])0x0;
      local_688 = SUB1613((undefined1  [16])0x0,0);
      uStack_67b = 0;
      iStack_678 = 0;
      bStack_674 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_6e8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)local_788,
                 (cpp_dec_float<200U,_int,_void> *)local_6e8,&local_290);
      puVar11 = (uint *)local_788;
      puVar15 = (uint *)local_648;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar15 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      iStack_5d8 = iStack_718;
      bStack_5d4 = bStack_714;
      local_5d0._0_4_ = (fpclass_type)local_710;
      local_5d0._4_4_ = local_710._4_4_;
      pfVar16 = &((local_5b8.
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).fpclass;
      lVar5 = 0;
      do {
        puVar11 = (uint *)local_648;
        puVar15 = local_110;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar15 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        lVar6 = (long)local_5b8.super_IdxSet.num;
        local_5b8.super_IdxSet.num = local_5b8.super_IdxSet.num + 1;
        local_5b8.super_IdxSet.idx[lVar6] = (int)lVar5;
        puVar11 = local_110;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)(pfVar16 + -0x1e);
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar11;
          puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
        }
        pfVar16[-2] = iStack_718;
        *(bool *)(pfVar16 + -1) = bStack_714;
        *(undefined8 *)pfVar16 = local_710;
        lVar5 = lVar5 + 1;
        pfVar16 = pfVar16 + 0x20;
      } while (lVar17 != lVar5);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_4e8,&local_5b8);
      local_6fc = iVar4;
      if (0 < maxiters) {
        uVar7 = 0;
        do {
          puVar8 = (undefined4 *)local_648;
          puVar13 = (undefined4 *)local_568;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar13 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar19 * -2 + 1;
            puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
          }
          iStack_4f8 = iStack_5d8;
          bStack_4f4 = bStack_5d4;
          local_4f0._0_4_ = (fpclass_type)local_5d0;
          local_4f0._4_4_ = local_5d0._4_4_;
          (*this->factor->_vptr_SLinSolver[0xd])(this->factor,&local_5b8,&local_4e8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_5b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6e8,&local_5b8);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6e8;
          puVar11 = (uint *)local_648;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar11 = (pnVar9->m_backend).data._M_elems[0];
            pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          }
          iStack_5d8 = iStack_678;
          bStack_5d4 = bStack_674;
          fVar1 = (fpclass_type)local_670;
          iVar2 = local_670._4_4_;
          local_5d0._0_4_ = (fpclass_type)local_670;
          local_5d0._4_4_ = local_670._4_4_;
          if (2 < uVar7) {
            puVar11 = (uint *)local_648;
            pcVar12 = &local_390;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pcVar12->data)._M_elems[0] = *puVar11;
              puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
            }
            local_390.exp = iStack_678;
            local_390.neg = bStack_674;
            local_390.fpclass = fVar1;
            local_390.prec_elem = iVar2;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_390,(cpp_dec_float<200U,_int,_void> *)local_568);
            pcVar12 = local_6f0;
            pcVar10 = &local_390;
            puVar11 = (uint *)local_6e8;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar11 = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4);
              puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            }
            iStack_678 = local_390.exp;
            bStack_674 = local_390.neg;
            local_670._4_4_ = local_390.prec_elem;
            local_670._0_4_ = local_390.fpclass;
            if ((local_390.neg == true) &&
               (local_390.fpclass != cpp_dec_float_finite || local_6e8._0_4_ != 0)) {
              bStack_674 = false;
            }
            local_710._0_4_ = cpp_dec_float_finite;
            local_710._4_4_ = 0x1c;
            local_788._0_16_ = (undefined1  [16])0x0;
            local_788._16_16_ = (undefined1  [16])0x0;
            local_768 = (undefined1  [16])0x0;
            local_758 = (undefined1  [16])0x0;
            local_748 = (undefined1  [16])0x0;
            local_738 = (undefined1  [16])0x0;
            local_728 = SUB1613((undefined1  [16])0x0,0);
            uStack_71b = 0;
            iStack_718 = 0;
            bStack_714 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_788 != local_6f0) {
              pcVar10 = local_6f0;
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_788;
              for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4)
                ;
              }
              iStack_718 = pcVar12->exp;
              bStack_714 = pcVar12->neg;
              local_710._0_4_ = pcVar12->fpclass;
              local_710._4_4_ = pcVar12->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_788,
                       (cpp_dec_float<200U,_int,_void> *)local_648);
            if ((((fpclass_type)local_670 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_710 != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_6e8,
                                   (cpp_dec_float<200U,_int,_void> *)local_788), iVar4 < 0)) break;
          }
          (*this->factor->_vptr_SLinSolver[0x15])(this->factor,&local_4e8,&local_5b8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setup(&local_4e8);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_290,&local_4e8);
          local_710._0_4_ = cpp_dec_float_finite;
          local_710._4_4_ = 0x1c;
          local_788._0_16_ = (undefined1  [16])0x0;
          local_788._16_16_ = (undefined1  [16])0x0;
          local_768 = (undefined1  [16])0x0;
          local_758 = (undefined1  [16])0x0;
          local_748 = (undefined1  [16])0x0;
          local_738 = (undefined1  [16])0x0;
          local_728 = SUB1613((undefined1  [16])0x0,0);
          uStack_71b = 0;
          iStack_718 = 0;
          bStack_714 = false;
          local_670._0_4_ = cpp_dec_float_finite;
          local_670._4_4_ = 0x1c;
          local_6e8._0_16_ = (undefined1  [16])0x0;
          local_6e8._16_16_ = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = SUB1613((undefined1  [16])0x0,0);
          uStack_67b = 0;
          iStack_678 = 0;
          bStack_674 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_6e8,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_788,
                     (cpp_dec_float<200U,_int,_void> *)local_6e8,&local_290);
          puVar11 = (uint *)local_788;
          puVar15 = (uint *)local_568;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          iStack_4f8 = iStack_718;
          bStack_4f4 = bStack_714;
          fVar1 = (fpclass_type)local_710;
          iVar2 = local_710._4_4_;
          local_4f0._0_4_ = (fpclass_type)local_710;
          local_4f0._4_4_ = local_710._4_4_;
          puVar11 = (uint *)local_568;
          pcVar12 = &local_210;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
          }
          local_210.exp = iStack_718;
          local_210.neg = bStack_714;
          local_210.fpclass = fVar1;
          local_210.prec_elem = iVar2;
          if (0 < (long)local_4e8.super_IdxSet.num) {
            uVar18 = (long)local_4e8.super_IdxSet.num + 1;
            do {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_4e8.
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [local_4e8.super_IdxSet.idx[uVar18 - 2]].m_backend,&local_210);
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != maxiters);
      }
      __return_storage_ptr__ =
           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_5c0;
      puVar11 = (uint *)local_648;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_418;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar11;
        puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar19 * -8 + 4);
      }
      iStack_3a8 = iStack_5d8;
      bStack_3a4 = bStack_5d4;
      local_3a0._0_4_ = (fpclass_type)local_5d0;
      local_3a0._4_4_ = local_5d0._4_4_;
      local_5c0->fpclass = cpp_dec_float_finite;
      local_5c0->prec_elem = 0x1c;
      (local_5c0->data)._M_elems[0] = 0;
      (local_5c0->data)._M_elems[1] = 0;
      (local_5c0->data)._M_elems[2] = 0;
      (local_5c0->data)._M_elems[3] = 0;
      (local_5c0->data)._M_elems[4] = 0;
      (local_5c0->data)._M_elems[5] = 0;
      (local_5c0->data)._M_elems[6] = 0;
      (local_5c0->data)._M_elems[7] = 0;
      (local_5c0->data)._M_elems[8] = 0;
      (local_5c0->data)._M_elems[9] = 0;
      (local_5c0->data)._M_elems[10] = 0;
      (local_5c0->data)._M_elems[0xb] = 0;
      (local_5c0->data)._M_elems[0xc] = 0;
      (local_5c0->data)._M_elems[0xd] = 0;
      (local_5c0->data)._M_elems[0xe] = 0;
      (local_5c0->data)._M_elems[0xf] = 0;
      (local_5c0->data)._M_elems[0x10] = 0;
      (local_5c0->data)._M_elems[0x11] = 0;
      (local_5c0->data)._M_elems[0x12] = 0;
      (local_5c0->data)._M_elems[0x13] = 0;
      (local_5c0->data)._M_elems[0x14] = 0;
      (local_5c0->data)._M_elems[0x15] = 0;
      (local_5c0->data)._M_elems[0x16] = 0;
      (local_5c0->data)._M_elems[0x17] = 0;
      (local_5c0->data)._M_elems[0x18] = 0;
      (local_5c0->data)._M_elems[0x19] = 0;
      (local_5c0->data)._M_elems[0x1a] = 0;
      (local_5c0->data)._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(local_5c0->data)._M_elems + 0x6d) = 0;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_498;
      if (((cpp_dec_float<200U,_int,_void> *)local_418 != local_5c0) &&
         (pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_418,
         (cpp_dec_float<200U,_int,_void> *)local_498 != local_5c0)) {
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_498;
        pcVar14 = local_5c0;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
        }
        local_5c0->exp = local_6fc;
        local_5c0->neg = bVar3;
        local_5c0->fpclass = local_6f4;
        local_5c0->prec_elem = local_6f8;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(local_5c0,pcVar12)
      ;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_4e8);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_5b8);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&__return_storage_ptr__->m_backend;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}